

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_allocator.h
# Opt level: O0

void * __thiscall
density::basic_default_allocator<65536UL>::allocate_page_zeroed
          (basic_default_allocator<65536UL> *this)

{
  PageAllocator<density::detail::SystemPageManager<65536UL>_> *this_00;
  void *pvVar1;
  bad_alloc *this_01;
  void *new_page;
  basic_default_allocator<65536UL> *this_local;
  
  this_00 = detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
            thread_local_instance();
  pvVar1 = detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
           try_allocate_page<(density::detail::page_allocation_type)1>(this_00,progress_blocking);
  if (pvVar1 == (void *)0x0) {
    this_01 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_01);
    __cxa_throw(this_01,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pvVar1;
}

Assistant:

void * allocate_page_zeroed()
        {
            auto const new_page =
              PageAllocator::thread_local_instance()
                .template try_allocate_page<detail::page_allocation_type::zeroed>(
                  progress_blocking);
            if (new_page == nullptr)
                throw std::bad_alloc();
            return new_page;
        }